

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O2

sunrealtype **
SplittingStepCoefficients_ComposeStrangHelper
          (int partitions,int order,int composition_stages,sunrealtype start,sunrealtype end,
          sunrealtype **beta)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  sunrealtype start_00;
  sunrealtype end_00;
  double dVar8;
  
  if (order == 2) {
    iVar3 = 0;
    if (0 < partitions) {
      iVar3 = partitions;
    }
    for (uVar1 = 1; uVar1 != iVar3 + 1; uVar1 = uVar1 + 1) {
      for (uVar2 = 0; (uint)partitions != uVar2; uVar2 = uVar2 + 1) {
        dVar7 = (end - start) * 0.5 + start;
        if (partitions <= (int)uVar1 + (int)uVar2) {
          dVar7 = end;
        }
        beta[uVar1][uVar2] = dVar7;
      }
    }
    beta = beta + (long)partitions + -1;
  }
  else {
    dVar7 = pow((double)(composition_stages + -1),1.0 / (double)(order + -1));
    dVar7 = (end - start) / ((double)(composition_stages + -1) - dVar7);
    iVar3 = 0;
    if (0 < composition_stages) {
      iVar3 = composition_stages;
    }
    iVar4 = -composition_stages;
    iVar5 = 2;
    dVar8 = 1.0;
    start_00 = start;
    while (iVar4 = iVar4 + 1, bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
      if (iVar5 < composition_stages) {
        end_00 = dVar8 * dVar7 + start;
      }
      else {
        end_00 = (double)iVar4 * dVar7 + end;
      }
      beta = SplittingStepCoefficients_ComposeStrangHelper
                       (partitions,order + -2,composition_stages,start_00,end_00,beta);
      dVar8 = dVar8 + 1.0;
      iVar5 = iVar5 + 2;
      start_00 = end_00;
    }
  }
  return beta;
}

Assistant:

static sunrealtype* const* SplittingStepCoefficients_ComposeStrangHelper(
  const int partitions, const int order, const int composition_stages,
  const sunrealtype start, const sunrealtype end, sunrealtype* const* const beta)
{
  const sunrealtype diff = end - start;
  if (order == 2)
  {
    /* The base case is an order 2 Strang splitting */
    const sunrealtype mid = start + diff / SUN_RCONST(2.0);
    for (int j = 1; j <= partitions; j++)
    {
      for (int k = 0; k < partitions; k++)
      {
        beta[j][k] = (k + j < partitions) ? mid : end;
      }
    }

    return &beta[partitions - 1];
  }

  sunrealtype* const* beta_cur = beta;
  sunrealtype start_cur        = start;
  /* This is essentially the gamma coefficient from Geometric Numerical
   * Integration (https://doi.org/10.1007/3-540-30666-8) pg 44-45 scaled by the
   * current interval */
  const sunrealtype gamma =
    diff / (composition_stages - 1 -
            SUNRpowerR(composition_stages - 1, SUN_RCONST(1.0) / (order - 1)));
  for (int i = 1; i <= composition_stages; i++)
  {
    /* To avoid roundoff issues, this ensures end_cur=1 for the last value of i*/
    const sunrealtype end_cur = 2 * i < composition_stages
                                  ? (start + i * gamma)
                                  : (end + (i - composition_stages) * gamma);
    /* Recursively generate coefficients and shift beta_cur */
    beta_cur  = SplittingStepCoefficients_ComposeStrangHelper(partitions,
                                                              order - 2,
                                                              composition_stages,
                                                              start_cur, end_cur,
                                                              beta_cur);
    start_cur = end_cur;
  }

  return beta_cur;
}